

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ssl_ext_pre_shared_key_parse_clienthello
               (SSL_HANDSHAKE *hs,CBS *out_ticket,CBS *out_binders,
               uint32_t *out_obfuscated_ticket_age,uint8_t *out_alert,SSL_CLIENT_HELLO *client_hello
               ,CBS *contents)

{
  int iVar1;
  int line;
  long lVar2;
  long lVar3;
  CBS identities;
  uint32_t unused_obfuscated_ticket_age;
  CBS unused_ticket;
  CBS local_68;
  CBS local_58;
  uint32_t local_44;
  CBS local_40;
  
  if (contents->data + contents->len != client_hello->extensions + client_hello->extensions_len) {
    iVar1 = 0x10b;
    line = 0x7af;
    goto LAB_00138070;
  }
  iVar1 = CBS_get_u16_length_prefixed(contents,&local_58);
  if (((((iVar1 == 0) || (iVar1 = CBS_get_u16_length_prefixed(&local_58,out_ticket), iVar1 == 0)) ||
       (iVar1 = CBS_get_u32(&local_58,out_obfuscated_ticket_age), iVar1 == 0)) ||
      ((iVar1 = CBS_get_u16_length_prefixed(contents,&local_68), iVar1 == 0 || (local_68.len == 0)))
      ) || (contents->len != 0)) {
    iVar1 = 0x7bc;
LAB_001380ec:
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,iVar1);
    *out_alert = '2';
    return false;
  }
  out_binders->data = local_68.data;
  out_binders->len = local_68.len;
  if (local_58.len == 0) {
    lVar3 = 1;
LAB_00138186:
    lVar2 = 0;
    do {
      iVar1 = CBS_get_u8_length_prefixed(&local_68,&local_40);
      if (iVar1 == 0) {
        iVar1 = 0x7d8;
        goto LAB_001380ec;
      }
      lVar2 = lVar2 + 1;
    } while (local_68.len != 0);
  }
  else {
    lVar3 = 1;
    do {
      iVar1 = CBS_get_u16_length_prefixed(&local_58,&local_40);
      if ((iVar1 == 0) || (iVar1 = CBS_get_u32(&local_58,&local_44), iVar1 == 0)) {
        iVar1 = 0x7ca;
        goto LAB_001380ec;
      }
      lVar3 = lVar3 + 1;
    } while (local_58.len != 0);
    if (local_68.len != 0) goto LAB_00138186;
    lVar2 = 0;
  }
  if (lVar3 == lVar2) {
    return true;
  }
  iVar1 = 0x10f;
  line = 0x7e1;
LAB_00138070:
  ERR_put_error(0x10,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,line);
  *out_alert = '/';
  return false;
}

Assistant:

bool ssl_ext_pre_shared_key_parse_clienthello(
    SSL_HANDSHAKE *hs, CBS *out_ticket, CBS *out_binders,
    uint32_t *out_obfuscated_ticket_age, uint8_t *out_alert,
    const SSL_CLIENT_HELLO *client_hello, CBS *contents) {
  // Verify that the pre_shared_key extension is the last extension in
  // ClientHello.
  if (CBS_data(contents) + CBS_len(contents) !=
      client_hello->extensions + client_hello->extensions_len) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PRE_SHARED_KEY_MUST_BE_LAST);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  // We only process the first PSK identity since we don't support pure PSK.
  CBS identities, binders;
  if (!CBS_get_u16_length_prefixed(contents, &identities) ||    //
      !CBS_get_u16_length_prefixed(&identities, out_ticket) ||  //
      !CBS_get_u32(&identities, out_obfuscated_ticket_age) ||   //
      !CBS_get_u16_length_prefixed(contents, &binders) ||       //
      CBS_len(&binders) == 0 ||                                 //
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  *out_binders = binders;

  // Check the syntax of the remaining identities, but do not process them.
  size_t num_identities = 1;
  while (CBS_len(&identities) != 0) {
    CBS unused_ticket;
    uint32_t unused_obfuscated_ticket_age;
    if (!CBS_get_u16_length_prefixed(&identities, &unused_ticket) ||
        !CBS_get_u32(&identities, &unused_obfuscated_ticket_age)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    num_identities++;
  }

  // Check the syntax of the binders. The value will be checked later if
  // resuming.
  size_t num_binders = 0;
  while (CBS_len(&binders) != 0) {
    CBS binder;
    if (!CBS_get_u8_length_prefixed(&binders, &binder)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    num_binders++;
  }

  if (num_identities != num_binders) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PSK_IDENTITY_BINDER_COUNT_MISMATCH);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  return true;
}